

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O2

int WebPPictureAllocARGB(WebPPicture *picture,int width,int height)

{
  int iVar1;
  void *pvVar2;
  WebPEncodingError WStack_20;
  
  WebPSafeFree(picture->memory_argb_);
  picture->memory_argb_ = (void *)0x0;
  picture->argb = (uint32_t *)0x0;
  picture->argb_stride = 0;
  if (width < 1 || height < 1) {
    WStack_20 = VP8_ENC_ERROR_BAD_DIMENSION;
  }
  else {
    pvVar2 = WebPSafeMalloc((ulong)(uint)height * (ulong)(uint)width + 0x1f,4);
    if (pvVar2 != (void *)0x0) {
      picture->memory_argb_ = pvVar2;
      picture->argb = (uint32_t *)((long)pvVar2 + 0x1fU & 0xffffffffffffffe0);
      picture->argb_stride = width;
      return 1;
    }
    WStack_20 = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  iVar1 = WebPEncodingSetError(picture,WStack_20);
  return iVar1;
}

Assistant:

int WebPPictureAllocARGB(WebPPicture* const picture, int width, int height) {
  void* memory;
  const uint64_t argb_size = (uint64_t)width * height;

  assert(picture != NULL);

  WebPSafeFree(picture->memory_argb_);
  WebPPictureResetBufferARGB(picture);

  if (width <= 0 || height <= 0) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_BAD_DIMENSION);
  }
  // allocate a new buffer.
  memory = WebPSafeMalloc(argb_size + WEBP_ALIGN_CST, sizeof(*picture->argb));
  if (memory == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  picture->memory_argb_ = memory;
  picture->argb = (uint32_t*)WEBP_ALIGN(memory);
  picture->argb_stride = width;
  return 1;
}